

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  int iVar1;
  size_type extraout_RDX;
  string_view spec_json_filename;
  string_view local_30;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> local_20;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator=
            (&s_stdout_stream,&local_20);
  std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::~unique_ptr(&local_20);
  ParseOptions(argv_local._4_4_,local_18);
  wabt::string_view::string_view(&local_30,s_infile);
  spec_json_filename.size_ = extraout_RDX;
  spec_json_filename.data_ = (char *)local_30.size_;
  iVar1 = spectest::ReadAndRunSpecJSON((spectest *)local_30.data_,spec_json_filename);
  return iVar1;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();

  ParseOptions(argc, argv);
  return spectest::ReadAndRunSpecJSON(s_infile);
}